

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  pointer obj;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_1;
  int i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  size_type last_bucket_count;
  int last_element;
  size_type empty_bucket_count;
  bool *in_stack_fffffffffffffe28;
  AssertionResult *in_stack_fffffffffffffe30;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe38;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  AssertHelper *in_stack_fffffffffffffe60;
  AssertionResult local_188;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  AssertionResult *in_stack_fffffffffffffea8;
  AssertHelper *in_stack_fffffffffffffeb0;
  int local_10c;
  string local_108 [55];
  undefined1 local_d1;
  AssertionResult local_d0 [2];
  int *local_b0;
  AssertionResult local_a8;
  pointer in_stack_ffffffffffffff68;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff70;
  char local_28 [20];
  int local_14;
  size_type local_10;
  
  bVar1 = google::
          HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::supports_clear_no_resize
                    ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    local_10 = google::
               BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xbaaafc);
    local_14 = 1;
    while (sVar2 = google::
                   BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xbaab1d), sVar2 == local_10) {
      in_stack_fffffffffffffe48 = (char *)(in_RDI + 0x10);
      in_stack_fffffffffffffe50 = local_28;
      HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
      std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xbaab7b)
      ;
      local_14 = local_14 + 1;
    }
    obj = (pointer)google::
                   BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xbaabc2);
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::clear_no_resize((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xbaabd8);
    local_b0 = (int *)google::
                      BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                      *)0xbaabe6);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               (unsigned_long *)in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe40 =
           testing::AssertionResult::failure_message((AssertionResult *)0xbaac4d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe60,(Type)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe50,
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0xbaacaa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaad18);
    local_d1 = google::
               BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::empty((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xbaad26);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(type *)0xbaad48);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 in_stack_fffffffffffffe90);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe60,(Type)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe50,
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_108);
      testing::Message::~Message((Message *)0xbaae1b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbaaeb2);
    for (local_10c = 1; local_10c < local_14; local_10c = local_10c + 1) {
      this_00 = (AssertHelper *)(in_RDI + 0x10);
      this_01 = (HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)&stack0xfffffffffffffee0;
      HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff70,(value_type *)obj);
      std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xbaaf27)
      ;
      google::
      BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbaaf35);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(unsigned_long *)this_01,
                 (unsigned_long *)this_00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        testing::AssertionResult::failure_message((AssertionResult *)0xbaafc2);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe60,(Type)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe50
                   ,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xbab00e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbab070);
    }
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ClearNoResize) {
  if (!this->ht_.supports_clear_no_resize()) return;
  typename TypeParam::size_type empty_bucket_count = this->ht_.bucket_count();
  int last_element = 1;
  while (this->ht_.bucket_count() == empty_bucket_count) {
    this->ht_.insert(this->UniqueObject(last_element));
    ++last_element;
  }
  typename TypeParam::size_type last_bucket_count = this->ht_.bucket_count();
  this->ht_.clear_no_resize();
  EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  EXPECT_TRUE(this->ht_.empty());

  // When inserting the same number of elements again, no resize
  // should be necessary.
  for (int i = 1; i < last_element; ++i) {
    this->ht_.insert(this->UniqueObject(last_element + i));
    EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  }
}